

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::ChromeCompositorSchedulerState::operator==
          (ChromeCompositorSchedulerState *this,ChromeCompositorSchedulerState *other)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  __n = (this->unknown_fields_)._M_string_length;
  if (__n == (other->unknown_fields_)._M_string_length) {
    if ((__n != 0) &&
       (iVar2 = bcmp((this->unknown_fields_)._M_dataplus._M_p,
                     (other->unknown_fields_)._M_dataplus._M_p,__n), iVar2 != 0)) {
      return false;
    }
    bVar1 = ChromeCompositorStateMachine::operator==
                      ((this->state_machine_).ptr_._M_t.
                       super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
                       .
                       super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_false>
                       ._M_head_impl,
                       (other->state_machine_).ptr_._M_t.
                       super___uniq_ptr_impl<perfetto::protos::gen::ChromeCompositorStateMachine,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_std::default_delete<perfetto::protos::gen::ChromeCompositorStateMachine>_>
                       .
                       super__Head_base<0UL,_perfetto::protos::gen::ChromeCompositorStateMachine_*,_false>
                       ._M_head_impl);
    if (((((bVar1) && (this->observing_begin_frame_source_ == other->observing_begin_frame_source_))
         && (this->begin_impl_frame_deadline_task_ == other->begin_impl_frame_deadline_task_)) &&
        (((this->pending_begin_frame_task_ == other->pending_begin_frame_task_ &&
          (this->skipped_last_frame_missed_exceeded_deadline_ ==
           other->skipped_last_frame_missed_exceeded_deadline_)) &&
         ((this->inside_action_ == other->inside_action_ &&
          ((this->deadline_mode_ == other->deadline_mode_ &&
           (this->deadline_us_ == other->deadline_us_)))))))) &&
       ((this->deadline_scheduled_at_us_ == other->deadline_scheduled_at_us_ &&
        (((((this->now_us_ == other->now_us_ &&
            (this->now_to_deadline_delta_us_ == other->now_to_deadline_delta_us_)) &&
           (this->now_to_deadline_scheduled_at_delta_us_ ==
            other->now_to_deadline_scheduled_at_delta_us_)) &&
          ((bVar1 = BeginImplFrameArgs::operator==
                              ((this->begin_impl_frame_args_).ptr_._M_t.
                               super___uniq_ptr_impl<perfetto::protos::gen::BeginImplFrameArgs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
                               .
                               super__Head_base<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_false>
                               ._M_head_impl,
                               (other->begin_impl_frame_args_).ptr_._M_t.
                               super___uniq_ptr_impl<perfetto::protos::gen::BeginImplFrameArgs,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_std::default_delete<perfetto::protos::gen::BeginImplFrameArgs>_>
                               .
                               super__Head_base<0UL,_perfetto::protos::gen::BeginImplFrameArgs_*,_false>
                               ._M_head_impl), bVar1 &&
           (bVar1 = BeginFrameObserverState::operator==
                              ((this->begin_frame_observer_state_).ptr_._M_t.
                               super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
                               .
                               super__Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false>
                               ._M_head_impl,
                               (other->begin_frame_observer_state_).ptr_._M_t.
                               super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
                               .
                               super__Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false>
                               ._M_head_impl), bVar1)))) &&
         (bVar1 = BeginFrameSourceState::operator==
                            ((this->begin_frame_source_state_).ptr_._M_t.
                             super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameSourceState,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameSourceState_*,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
                             .
                             super__Head_base<0UL,_perfetto::protos::gen::BeginFrameSourceState_*,_false>
                             ._M_head_impl,
                             (other->begin_frame_source_state_).ptr_._M_t.
                             super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameSourceState,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameSourceState_*,_std::default_delete<perfetto::protos::gen::BeginFrameSourceState>_>
                             .
                             super__Head_base<0UL,_perfetto::protos::gen::BeginFrameSourceState_*,_false>
                             ._M_head_impl), bVar1)))))) {
      bVar1 = CompositorTimingHistory::operator==
                        ((this->compositor_timing_history_).ptr_._M_t.
                         super___uniq_ptr_impl<perfetto::protos::gen::CompositorTimingHistory,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
                         .
                         super__Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false>
                         ._M_head_impl,
                         (other->compositor_timing_history_).ptr_._M_t.
                         super___uniq_ptr_impl<perfetto::protos::gen::CompositorTimingHistory,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_std::default_delete<perfetto::protos::gen::CompositorTimingHistory>_>
                         .
                         super__Head_base<0UL,_perfetto::protos::gen::CompositorTimingHistory_*,_false>
                         ._M_head_impl);
      return bVar1;
    }
  }
  return false;
}

Assistant:

T&& value() && {
    PERFETTO_CHECK(storage_.is_populated_);
    return std::move(storage_.value_);
  }